

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteDouble
               (int field_number,double value,CodedOutputStream *output)

{
  uint64 in_RSI;
  int in_EDI;
  CodedOutputStream *in_XMM0_Qa;
  CodedOutputStream *in_stack_ffffffffffffffc0;
  uint64 value_00;
  
  value_00 = in_RSI;
  MakeTag(in_EDI,WIRETYPE_FIXED64);
  io::CodedOutputStream::WriteTag(in_stack_ffffffffffffffc0,(uint32)(in_RSI >> 0x20));
  EncodeDouble((double)in_XMM0_Qa);
  io::CodedOutputStream::WriteLittleEndian64(in_XMM0_Qa,value_00);
  return;
}

Assistant:

void WireFormatLite::WriteDouble(int field_number, double value,
                                 io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_FIXED64, output);
  WriteDoubleNoTag(value, output);
}